

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

void init_dungeons(void)

{
  couple cVar1;
  boolean bVar2;
  xchar xVar3;
  int iVar4;
  dlb *stream;
  branch *pbVar5;
  int local_164c;
  s_level *local_1640;
  s_level *s_prev;
  s_level *s_curr;
  branch *br_2;
  branch *br_1;
  boolean from_up;
  schar from_depth;
  branch *br;
  char local_1608 [4];
  int j;
  char tbuf [256];
  undefined1 local_14fc [8];
  version_info vers_info;
  level_map *lev_map;
  proto_dungeon pd;
  s_level *x;
  int local_18;
  int cb;
  int cl;
  int i;
  dlb *dgn_file;
  
  local_18 = 0;
  x._4_4_ = 0;
  pd.start = 0;
  pd.tmpbranch[0x1f].up = 0;
  stream = dlb_fopen("dungeon","r");
  if (stream == (dlb *)0x0) {
    sprintf(local_1608,"Cannot open dungeon description - \"%s","dungeon");
    strcat(local_1608,"\" from ");
    strcat(local_1608,"\n\"");
    if (fqn_prefix[1] != (char *)0x0) {
      strcat(local_1608,fqn_prefix[1]);
    }
    strcat(local_1608,"nhdat");
    strcat(local_1608,"\" file!");
    panic(local_1608);
  }
  Fread(local_14fc,0xc,1,stream);
  bVar2 = check_version((version_info *)local_14fc,"dungeon",'\x01');
  if (bVar2 == '\0') {
    panic("Dungeon description not valid.");
  }
  sp_levchn = (s_level *)0x0;
  Fread(&n_dgns,4,1,stream);
  if (0xf < n_dgns) {
    panic("init_dungeons: too many dungeons");
  }
  memset(dungeons,0,0x380);
  for (cb = 0; cb < n_dgns; cb = cb + 1) {
    Fread(&pd.tmpdungeon[(long)cb + -1].entry_lev,0x4c,1,stream);
    if (((flags.debug == '\0') && (pd.tmpdungeon[cb].lev != (couple)0x0)) &&
       (cVar1 = pd.tmpdungeon[cb].lev, iVar4 = rn2(100), (int)cVar1 <= iVar4)) {
      for (br._4_4_ = 0; br._4_4_ < pd.tmpdungeon[cb].flags; br._4_4_ = br._4_4_ + 1) {
        Fread(&pd.tmplevel[(long)local_18 + -1].flags,0x30,1,stream);
      }
      for (br._4_4_ = 0; br._4_4_ < pd.tmpdungeon[cb].chance; br._4_4_ = br._4_4_ + 1) {
        Fread(&pd.tmpbranch[(long)x._4_4_ + -1].type,0x28,1,stream);
      }
      n_dgns = n_dgns + -1;
      cb = cb + -1;
    }
    else {
      strcpy(dungeons[cb].dname,(char *)&pd.tmpdungeon[(long)cb + -1].entry_lev);
      strcpy(dungeons[cb].proto,pd.tmpdungeon[cb].name + 0x10);
      dungeons[cb].boneid = (char)pd.tmpdungeon[cb].branches;
      if (*(short *)(pd.tmpdungeon[cb].protoname + 0x12) == 0) {
        dungeons[cb].num_dunlevs = (xchar)*(undefined2 *)(pd.tmpdungeon[cb].protoname + 0x10);
      }
      else {
        iVar4 = rn2((int)*(short *)(pd.tmpdungeon[cb].protoname + 0x12));
        dungeons[cb].num_dunlevs =
             (char)iVar4 + (char)*(undefined2 *)(pd.tmpdungeon[cb].protoname + 0x10);
      }
      if (cb == 0) {
        dungeons[0].ledger_start = 0;
        dungeons[0].depth_start = 1;
        dungeons[0].dunlev_ureached = '\x01';
      }
      else {
        dungeons[cb].ledger_start =
             dungeons[cb + -1].ledger_start + (int)dungeons[cb + -1].num_dunlevs;
        dungeons[cb].dunlev_ureached = '\0';
      }
      *(byte *)&dungeons[cb].flags =
           *(byte *)&dungeons[cb].flags & 0xfd |
           ((*(uint *)(pd.tmpdungeon[cb].protoname + 0x14) & 2) != 0) << 1;
      *(byte *)&dungeons[cb].flags =
           *(byte *)&dungeons[cb].flags & 0xfb |
           ((*(uint *)(pd.tmpdungeon[cb].protoname + 0x14) & 4) != 0) << 2;
      *(byte *)&dungeons[cb].flags =
           *(byte *)&dungeons[cb].flags & 0xf7 |
           ((*(uint *)(pd.tmpdungeon[cb].protoname + 0x14) & 8) != 0) << 3;
      *(byte *)&dungeons[cb].flags =
           *(byte *)&dungeons[cb].flags & 0x8f |
           (char)((int)(*(uint *)(pd.tmpdungeon[cb].protoname + 0x14) & 0x70) >> 4) << 4;
      if (pd.tmpdungeon[cb].levels < 0) {
        dungeons[cb].entry_lev = dungeons[cb].num_dunlevs + (char)pd.tmpdungeon[cb].levels + '\x01';
        if (dungeons[cb].entry_lev < '\x01') {
          dungeons[cb].entry_lev = '\x01';
        }
      }
      else if (pd.tmpdungeon[cb].levels < 1) {
        dungeons[cb].entry_lev = '\x01';
      }
      else {
        dungeons[cb].entry_lev = (xchar)pd.tmpdungeon[cb].levels;
        if (dungeons[cb].num_dunlevs < dungeons[cb].entry_lev) {
          dungeons[cb].entry_lev = dungeons[cb].num_dunlevs;
        }
      }
      if (cb != 0) {
        pbVar5 = add_branch(cb,(int)dungeons[cb].entry_lev,(proto_dungeon *)&lev_map);
        if ((pbVar5->end1).dnum == cb) {
          br_1._7_1_ = depth(&pbVar5->end2);
          br_1._6_1_ = (pbVar5->end1_up != '\0' ^ 0xffU) & 1;
        }
        else {
          br_1._7_1_ = depth(&pbVar5->end1);
          br_1._6_1_ = pbVar5->end1_up;
        }
        if (pbVar5->type == 3) {
          local_164c = 0;
        }
        else {
          local_164c = 1;
          if (br_1._6_1_ != 0) {
            local_164c = -1;
          }
        }
        dungeons[cb].depth_start = (br_1._7_1_ + local_164c) - (dungeons[cb].entry_lev + -1);
      }
      if (' ' < dungeons[cb].num_dunlevs) {
        dungeons[cb].num_dunlevs = ' ';
      }
      pd.tmpbranch[0x1f].type = pd.tmpbranch[0x1f].up;
      pd.tmpbranch[0x1f].up = pd.tmpdungeon[cb].flags + pd.tmpbranch[0x1f].up;
      if (0x32 < pd.tmpbranch[0x1f].up) {
        panic("init_dungeon: too many special levels");
      }
      for (; local_18 < pd.tmpbranch[0x1f].up; local_18 = local_18 + 1) {
        Fread(&pd.tmplevel[(long)local_18 + -1].flags,0x30,1,stream);
        init_level(cb,local_18,(proto_dungeon *)&lev_map);
      }
      bVar2 = place_level(pd.tmpbranch[0x1f].type,(proto_dungeon *)&lev_map);
      if (bVar2 == '\0') {
        panic("init_dungeon:  couldn\'t place levels");
      }
      for (; pd.tmpbranch[0x1f].type < pd.tmpbranch[0x1f].up;
          pd.tmpbranch[0x1f].type = pd.tmpbranch[0x1f].type + 1) {
        if (pd.final_lev[(long)pd.tmpbranch[0x1f].type + -1] != (s_level *)0x0) {
          add_level(pd.final_lev[(long)pd.tmpbranch[0x1f].type + -1]);
        }
      }
      pd.start = pd.tmpdungeon[cb].chance + pd.start;
      if (0x20 < pd.start) {
        panic("init_dungeon: too many branches");
      }
      for (; x._4_4_ < pd.start; x._4_4_ = x._4_4_ + 1) {
        Fread(&pd.tmpbranch[(long)x._4_4_ + -1].type,0x28,1,stream);
      }
    }
  }
  dlb_fclose(stream);
  for (cb = 0; cb < 5; cb = cb + 1) {
    iVar4 = rn2(7);
    tune[cb] = (char)iVar4 + 'A';
  }
  tune[5] = '\0';
  for (vers_info._4_8_ = level_map; **(char **)vers_info._4_8_ != '\0';
      vers_info._4_8_ = vers_info._4_8_ + 0x10) {
    iVar4 = strncmp(*(char **)vers_info._4_8_,"rogue",6);
    if (((iVar4 != 0) || (flags.rogue_enabled != '\0')) &&
       (pd._5304_8_ = find_level(*(char **)vers_info._4_8_),
       (s_level *)pd._5304_8_ != (s_level *)0x0)) {
      assign_level(*(d_level **)(vers_info._4_8_ + 8),&((s_level *)pd._5304_8_)->dlevel);
      iVar4 = strncmp(*(char **)vers_info._4_8_,"x-",2);
      if (iVar4 == 0) {
        sprintf((char *)(pd._5304_8_ + 10),"%s%s",urole.filecode,*(long *)vers_info._4_8_ + 1);
      }
      else if (*(long *)(vers_info._4_8_ + 8) == 0x3d7f44) {
        br_2 = branches;
        while ((br_2 != (branch *)0x0 &&
               (bVar2 = on_level(&br_2->end2,&dungeon_topology.d_knox_level), bVar2 == '\0'))) {
          br_2 = br_2->next;
        }
        if (br_2 != (branch *)0x0) {
          (br_2->end1).dnum = (xchar)n_dgns;
        }
        insert_branch(br_2,'\x01');
      }
      else if (*(long *)(vers_info._4_8_ + 8) == 0x3d7f46) {
        s_curr = (s_level *)branches;
        while ((s_curr != (s_level *)0x0 &&
               (bVar2 = on_level((d_level *)(s_curr->proto + 8),&dungeon_topology.d_advcal_level),
               bVar2 == '\0'))) {
          s_curr = s_curr->next;
        }
        if (s_curr != (s_level *)0x0) {
          s_curr->proto[6] = (char)n_dgns;
        }
        insert_branch((branch *)s_curr,'\x01');
      }
    }
  }
  if (flags.rogue_enabled == '\0') {
    local_1640 = (s_level *)0x0;
    for (s_prev = sp_levchn; s_prev != (s_level *)0x0; s_prev = s_prev->next) {
      iVar4 = strncmp(s_prev->proto,"rogue",6);
      if (iVar4 == 0) {
        if (local_1640 == (s_level *)0x0) {
          sp_levchn = s_prev->next;
        }
        else {
          local_1640->next = s_prev->next;
        }
        break;
      }
      local_1640 = s_prev;
    }
  }
  dungeon_topology.d_quest_dnum = dname_to_dnum("The Quest",'\0');
  dungeon_topology.d_sokoban_dnum = dname_to_dnum("Sokoban",'\0');
  dungeon_topology.d_mines_dnum = dname_to_dnum("The Gnomish Mines",'\0');
  dungeon_topology.d_tower_dnum = dname_to_dnum("Vlad\'s Tower",'\0');
  dungeon_topology.d_mall_dnum = dname_to_dnum("Town",'\0');
  dungeon_topology.d_dragon_dnum = dname_to_dnum("The Dragon Caves",'\x01');
  pd._5304_8_ = find_level("dummy");
  if ((s_level *)pd._5304_8_ != (s_level *)0x0) {
    iVar4 = (int)(((s_level *)pd._5304_8_)->dlevel).dnum;
    xVar3 = dunlevs_in_dungeon(&((s_level *)pd._5304_8_)->dlevel);
    if (1 - dungeons[iVar4].depth_start < (int)xVar3) {
      dungeons[iVar4].depth_start = dungeons[iVar4].depth_start + -1;
    }
  }
  shuffle_planes();
  return;
}

Assistant:

void init_dungeons(void)	/* initialize the "dungeon" structs */
{
	dlb	*dgn_file;
	int i, cl = 0, cb = 0;
	s_level *x;
	struct proto_dungeon pd;
	const struct level_map *lev_map;
	struct version_info vers_info;

	pd.n_levs = pd.n_brs = 0;

	dgn_file = dlb_fopen(DUNGEON_FILE, RDBMODE);
	if (!dgn_file) {
	    char tbuf[BUFSZ];
	    sprintf(tbuf, "Cannot open dungeon description - \"%s",
		DUNGEON_FILE);
	    strcat(tbuf, "\" from ");
	    strcat(tbuf, "\n\"");
	    if (fqn_prefix[DATAPREFIX]) strcat(tbuf, fqn_prefix[DATAPREFIX]);
	    strcat(tbuf, DLBFILE);
	    strcat(tbuf, "\" file!");
	    panic(tbuf);
	}

	/* validate the data's version against the program's version */
	Fread(&vers_info, sizeof vers_info, 1, dgn_file);
	
	if (!check_version(&vers_info, DUNGEON_FILE, TRUE))
	    panic("Dungeon description not valid.");

	/*
	 * Read in each dungeon and transfer the results to the internal
	 * dungeon arrays.
	 */
	sp_levchn = NULL;
	Fread(&n_dgns, sizeof(int), 1, dgn_file);
	if (n_dgns >= MAXDUNGEON)
	    panic("init_dungeons: too many dungeons");

	/*
	 * Zero-out dungeons to prevent replay desyncs, specifically the data
	 * beyond the ends of each dungeon's name/protoname fields.
	 */
	memset(dungeons, 0, MAXDUNGEON * sizeof(dungeon));

	for (i = 0; i < n_dgns; i++) {
	    Fread(&pd.tmpdungeon[i], sizeof(struct tmpdungeon), 1, dgn_file);
	    if (!wizard)
	      if (pd.tmpdungeon[i].chance && (pd.tmpdungeon[i].chance <= rn2(100))) {
		int j;

		/* skip over any levels or branches */
		for (j = 0; j < pd.tmpdungeon[i].levels; j++)
		    Fread(&pd.tmplevel[cl], sizeof(struct tmplevel), 1, dgn_file);

		for (j = 0; j < pd.tmpdungeon[i].branches; j++)
		    Fread(&pd.tmpbranch[cb],
					sizeof(struct tmpbranch), 1, dgn_file);
		n_dgns--; i--;
		continue;
	      }

	    strcpy(dungeons[i].dname, pd.tmpdungeon[i].name);
	    strcpy(dungeons[i].proto, pd.tmpdungeon[i].protoname);
	    dungeons[i].boneid = pd.tmpdungeon[i].boneschar;

	    if (pd.tmpdungeon[i].lev.rand)
		dungeons[i].num_dunlevs = (xchar)rn1(pd.tmpdungeon[i].lev.rand,
						     pd.tmpdungeon[i].lev.base);
	    else dungeons[i].num_dunlevs = (xchar)pd.tmpdungeon[i].lev.base;

	    if (!i) {
		dungeons[i].ledger_start = 0;
		dungeons[i].depth_start = 1;
		dungeons[i].dunlev_ureached = 1;
	    } else {
		dungeons[i].ledger_start = dungeons[i-1].ledger_start +
					      dungeons[i-1].num_dunlevs;
		dungeons[i].dunlev_ureached = 0;
	    }

	    dungeons[i].flags.hellish = !!(pd.tmpdungeon[i].flags & HELLISH);
	    dungeons[i].flags.maze_like = !!(pd.tmpdungeon[i].flags & MAZELIKE);
	    dungeons[i].flags.rogue_like = !!(pd.tmpdungeon[i].flags & ROGUELIKE);
	    dungeons[i].flags.align = ((pd.tmpdungeon[i].flags & D_ALIGN_MASK) >> 4);
	    /*
	     * Set the entry level for this dungeon.  The pd.tmpdungeon entry
	     * value means:
	     *		< 0	from bottom (-1 == bottom level)
	     *		  0	default (top)
	     *		> 0	actual level (1 = top)
	     *
	     * Note that the entry_lev field in the dungeon structure is
	     * redundant.  It is used only here and in print_dungeon().
	     */
	    if (pd.tmpdungeon[i].entry_lev < 0) {
		dungeons[i].entry_lev = dungeons[i].num_dunlevs +
						pd.tmpdungeon[i].entry_lev + 1;
		if (dungeons[i].entry_lev <= 0) dungeons[i].entry_lev = 1;
	    } else if (pd.tmpdungeon[i].entry_lev > 0) {
		dungeons[i].entry_lev = pd.tmpdungeon[i].entry_lev;
		if (dungeons[i].entry_lev > dungeons[i].num_dunlevs)
		    dungeons[i].entry_lev = dungeons[i].num_dunlevs;
	    } else { /* default */
		dungeons[i].entry_lev = 1;	/* defaults to top level */
	    }

	    if (i) {	/* set depth */
		branch *br;
		schar from_depth;
		boolean from_up;

		br = add_branch(i, dungeons[i].entry_lev, &pd);

		/* Get the depth of the connecting end. */
		if (br->end1.dnum == i) {
		    from_depth = depth(&br->end2);
		    from_up = !br->end1_up;
		} else {
		    from_depth = depth(&br->end1);
		    from_up = br->end1_up;
		}

		/*
		 * Calculate the depth of the top of the dungeon via
		 * its branch.  First, the depth of the entry point:
		 *
		 *	depth of branch from "parent" dungeon
		 *	+ -1 or 1 depending on a up or down stair or
		 *	  0 if portal
		 *
		 * Followed by the depth of the top of the dungeon:
		 *
		 *	- (entry depth - 1)
		 *
		 * We'll say that portals stay on the same depth.
		 */
		dungeons[i].depth_start = from_depth
					+ (br->type == BR_PORTAL ? 0 :
							(from_up ? -1 : 1))
					- (dungeons[i].entry_lev - 1);
	    }

	    /* this is redundant - it should have been flagged by dgn_comp */
	    if (dungeons[i].num_dunlevs > MAXLEVEL)
		dungeons[i].num_dunlevs = MAXLEVEL;

	    pd.start = pd.n_levs;	/* save starting point */
	    pd.n_levs += pd.tmpdungeon[i].levels;
	    if (pd.n_levs > LEV_LIMIT)
		panic("init_dungeon: too many special levels");
	    
	    /*
	     * Read in the prototype special levels.  Don't add generated
	     * special levels until they are all placed.
	     */
	    for (; cl < pd.n_levs; cl++) {
		Fread(&pd.tmplevel[cl], sizeof(struct tmplevel), 1, dgn_file);
		init_level(i, cl, &pd);
	    }
	    
	    /*
	     * Recursively place the generated levels for this dungeon.  This
	     * routine will attempt all possible combinations before giving
	     * up.
	     */
	    if (!place_level(pd.start, &pd))
		panic("init_dungeon:  couldn't place levels");

	    for (; pd.start < pd.n_levs; pd.start++)
		if (pd.final_lev[pd.start]) add_level(pd.final_lev[pd.start]);


	    pd.n_brs += pd.tmpdungeon[i].branches;
	    if (pd.n_brs > BRANCH_LIMIT)
		panic("init_dungeon: too many branches");
	    for (; cb < pd.n_brs; cb++)
		Fread(&pd.tmpbranch[cb],
					sizeof(struct tmpbranch), 1, dgn_file);
	}
	dlb_fclose(dgn_file);

	for (i = 0; i < 5; i++) tune[i] = 'A' + rn2(7);
	tune[5] = 0;

	/*
	 * Find most of the special levels and dungeons so we can access their
	 * locations quickly.
	 */
	for (lev_map = level_map; lev_map->lev_name[0]; lev_map++) {
		/* 
		 * suppress finding the rogue level if it is not enabled
		 * this makes Is_rogue_level(x) fail
		 */
		if (!strncmp(lev_map->lev_name, "rogue", 6) &&
		    !flags.rogue_enabled)
		    continue;
		
		x = find_level(lev_map->lev_name);
		if (x) {
			assign_level(lev_map->lev_spec, &x->dlevel);
			if (!strncmp(lev_map->lev_name, "x-", 2)) {
				/* This is where the name substitution on the
				 * levels of the quest dungeon occur.
				 */
				sprintf(x->proto, "%s%s", urole.filecode, &lev_map->lev_name[1]);
			} else if (lev_map->lev_spec == &knox_level) {
				branch *br;
				/*
				 * Kludge to allow floating Knox entrance.  We
				 * specify a floating entrance by the fact that
				 * its entrance (end1) has a bogus dnum, namely
				 * n_dgns.
				 */
				for (br = branches; br; br = br->next)
				    if (on_level(&br->end2, &knox_level)) break;

				if (br) br->end1.dnum = n_dgns;
				/* adjust the branch's position on the list */
				insert_branch(br, TRUE);
			} else if (lev_map->lev_spec == &advcal_level) {
				branch *br;
				/*
				 * Kludge to allow floating advcal entrance.  We
				 * specify a floating entrance by the fact that
				 * its entrance (end1) has a bogus dnum, namely
				 * n_dgns.
				 */
				for (br = branches; br; br = br->next)
				    if (on_level(&br->end2, &advcal_level)) break;

				if (br) br->end1.dnum = n_dgns;
				/* adjust the branch's position on the list */
				insert_branch(br, TRUE);
			}
		}
	}
	
	if (!flags.rogue_enabled) {
	    /* 
	     * remove rogue level from the special level chain
	     * This makes Is_special(x) return NULL, so the level will never be
	     * instantiated
	     */
	    s_level *s_curr, *s_prev;
	    s_prev = NULL;
	    for (s_curr = sp_levchn; s_curr; s_curr = s_curr->next) {
		if (!strncmp(s_curr->proto, "rogue", 6)) {
		    if (s_prev)
			s_prev->next = s_curr->next;
		    else
			sp_levchn = s_curr->next;
		    
		    break;
		}
		s_prev = s_curr;
	    }
	}

/*
 *	I hate hardwiring these names. :-(
 */
	quest_dnum = dname_to_dnum("The Quest", FALSE);
	sokoban_dnum = dname_to_dnum("Sokoban", FALSE);
	mines_dnum = dname_to_dnum("The Gnomish Mines", FALSE);
	tower_dnum = dname_to_dnum("Vlad's Tower", FALSE);
	mall_dnum = dname_to_dnum("Town", FALSE);
	dragon_dnum = dname_to_dnum("The Dragon Caves", TRUE);

	/* one special fixup for dummy surface level */
	if ((x = find_level("dummy")) != 0) {
	    i = x->dlevel.dnum;
	    /* the code above puts earth one level above dungeon level #1,
	       making the dummy level overlay level 1; but the whole reason
	       for having the dummy level is to make earth have depth -1
	       instead of 0, so adjust the start point to shift endgame up */
	    if (dunlevs_in_dungeon(&x->dlevel) > 1 - dungeons[i].depth_start)
		dungeons[i].depth_start -= 1;
	    /* TO DO: strip "dummy" out all the way here,
	       so that it's hidden from <ctrl/O> feedback. */
	}

	shuffle_planes();
}